

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

exception * __thiscall
nlohmann::json_abi_v3_12_0::detail::exception::name(exception *this,string *ename,int id_)

{
  __cxx11 local_40 [35];
  char local_1d;
  int local_1c;
  string *psStack_18;
  int id__local;
  string *ename_local;
  
  local_1d = '.';
  local_1c = id_;
  psStack_18 = ename;
  ename_local = (string *)this;
  std::__cxx11::to_string(local_40,id_);
  concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[3]>
            ((detail *)this,(char (*) [17])"[json.exception.",ename,&local_1d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [3])"] ");
  std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return concat("[json.exception.", ename, '.', std::to_string(id_), "] ");
    }